

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrReferenceContext.cpp
# Opt level: O2

void __thiscall
sglr::ReferenceContext::texStorage2D
          (ReferenceContext *this,deUint32 target,int levels,deUint32 internalFormat,int width,
          int height)

{
  pointer pTVar1;
  uint uVar2;
  uint uVar3;
  int level;
  int iVar4;
  int face;
  CubeFace face_00;
  Texture2D *this_00;
  TextureCube *this_01;
  TextureFormat local_38;
  
  if (0 < width && 0 < height) {
    uVar2 = height;
    if ((uint)height < (uint)width) {
      uVar2 = width;
    }
    uVar3 = 0x20;
    if (uVar2 != 0) {
      uVar3 = 0x1f;
      if (uVar2 != 0) {
        for (; uVar2 >> uVar3 == 0; uVar3 = uVar3 - 1) {
        }
      }
      uVar3 = uVar3 ^ 0x1f;
    }
    if ((0 < levels) && (levels <= (int)(0x20 - uVar3))) {
      iVar4 = this->m_activeTexture;
      pTVar1 = (this->m_textureUnits).
               super__Vector_base<sglr::ReferenceContext::TextureUnit,_std::allocator<sglr::ReferenceContext::TextureUnit>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_38 = mapInternalFormat(internalFormat);
      if (local_38.order == CHANNELORDER_LAST || local_38.type == CHANNELTYPE_LAST) {
LAB_015243bb:
        if (this->m_lastError != 0) {
          return;
        }
        this->m_lastError = 0x500;
        return;
      }
      if (target == 0x8513) {
        this_01 = &pTVar1[iVar4].defaultCubeTex;
        if (pTVar1[iVar4].texCubeBinding != (TextureCube *)0x0) {
          this_01 = pTVar1[iVar4].texCubeBinding;
        }
        iVar4 = (this->m_limits).maxTextureCubeSize;
        if (width <= iVar4 && height <= iVar4) {
          if ((this_01->super_Texture).m_immutable != true) {
            rc::TextureCube::clearLevels(this_01);
            (this_01->super_Texture).m_immutable = true;
            for (iVar4 = 0; iVar4 != levels; iVar4 = iVar4 + 1) {
              uVar2 = (uint)width >> ((byte)iVar4 & 0x1f);
              if ((int)uVar2 < 2) {
                uVar2 = 1;
              }
              uVar3 = (uint)height >> ((byte)iVar4 & 0x1f);
              if ((int)uVar3 < 2) {
                uVar3 = 1;
              }
              for (face_00 = CUBEFACE_NEGATIVE_X; face_00 != CUBEFACE_LAST;
                  face_00 = face_00 + CUBEFACE_POSITIVE_X) {
                rc::TextureCube::allocFace(this_01,iVar4,face_00,&local_38,uVar2,uVar3);
              }
            }
            return;
          }
LAB_01524412:
          if (this->m_lastError != 0) {
            return;
          }
          this->m_lastError = 0x502;
          return;
        }
      }
      else {
        if (target != 0xde1) goto LAB_015243bb;
        this_00 = &pTVar1[iVar4].default2DTex;
        if (pTVar1[iVar4].tex2DBinding != (Texture2D *)0x0) {
          this_00 = pTVar1[iVar4].tex2DBinding;
        }
        iVar4 = (this->m_limits).maxTexture2DSize;
        if (width <= iVar4 && height < iVar4) {
          if ((this_00->super_Texture).m_immutable != true) {
            rc::TextureLevelArray::clear(&this_00->m_levels);
            (this_00->super_Texture).m_immutable = true;
            for (iVar4 = 0; levels != iVar4; iVar4 = iVar4 + 1) {
              uVar2 = (uint)width >> ((byte)iVar4 & 0x1f);
              if ((int)uVar2 < 2) {
                uVar2 = 1;
              }
              uVar3 = (uint)height >> ((byte)iVar4 & 0x1f);
              if ((int)uVar3 < 2) {
                uVar3 = 1;
              }
              rc::Texture2D::allocLevel(this_00,iVar4,&local_38,uVar2,uVar3);
            }
            return;
          }
          goto LAB_01524412;
        }
      }
    }
  }
  if (this->m_lastError == 0) {
    this->m_lastError = 0x501;
  }
  return;
}

Assistant:

void ReferenceContext::texStorage2D (deUint32 target, int levels, deUint32 internalFormat, int width, int height)
{
	TextureUnit&		unit		= m_textureUnits[m_activeTexture];
	TextureFormat		storageFmt;

	RC_IF_ERROR(width <= 0 || height <= 0, GL_INVALID_VALUE, RC_RET_VOID);
	RC_IF_ERROR(!de::inRange(levels, 1, (int)deLog2Floor32(de::max(width, height))+1), GL_INVALID_VALUE, RC_RET_VOID);

	// Map storage format.
	storageFmt = mapInternalFormat(internalFormat);
	RC_IF_ERROR(storageFmt.order	== TextureFormat::CHANNELORDER_LAST ||
				storageFmt.type		== TextureFormat::CHANNELTYPE_LAST, GL_INVALID_ENUM, RC_RET_VOID);

	if (target == GL_TEXTURE_2D)
	{
		Texture2D& texture = unit.tex2DBinding ? *unit.tex2DBinding : unit.default2DTex;

		RC_IF_ERROR(width > m_limits.maxTexture2DSize || height >= m_limits.maxTexture2DSize, GL_INVALID_VALUE, RC_RET_VOID);
		RC_IF_ERROR(texture.isImmutable(), GL_INVALID_OPERATION, RC_RET_VOID);

		texture.clearLevels();
		texture.setImmutable();

		for (int level = 0; level < levels; level++)
		{
			int levelW = de::max(1, width >> level);
			int levelH = de::max(1, height >> level);

			texture.allocLevel(level, storageFmt, levelW, levelH);
		}
	}
	else if (target == GL_TEXTURE_CUBE_MAP)
	{
		TextureCube& texture = unit.texCubeBinding ? *unit.texCubeBinding : unit.defaultCubeTex;

		RC_IF_ERROR(width > m_limits.maxTextureCubeSize || height > m_limits.maxTextureCubeSize, GL_INVALID_VALUE, RC_RET_VOID);
		RC_IF_ERROR(texture.isImmutable(), GL_INVALID_OPERATION, RC_RET_VOID);

		texture.clearLevels();
		texture.setImmutable();

		for (int level = 0; level < levels; level++)
		{
			int levelW = de::max(1, width >> level);
			int levelH = de::max(1, height >> level);

			for (int face = 0; face < tcu::CUBEFACE_LAST; face++)
				texture.allocFace(level, (tcu::CubeFace)face, storageFmt, levelW, levelH);
		}
	}
	else
		RC_ERROR_RET(GL_INVALID_ENUM, RC_RET_VOID);
}